

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_log.cc
# Opt level: O2

bool __thiscall BuildLog::OpenForWrite(BuildLog *this,string *path,BuildLogUser *user,string *err)

{
  bool bVar1;
  
  if ((this->needs_recompaction_ == true) && (bVar1 = Recompact(this,path,user,err), !bVar1)) {
    return false;
  }
  if (this->log_file_ == (FILE *)0x0) {
    std::__cxx11::string::_M_assign((string *)&this->log_file_path_);
    return true;
  }
  __assert_fail("!log_file_",
                "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_log.cc"
                ,0x8a,"bool BuildLog::OpenForWrite(const string &, const BuildLogUser &, string *)")
  ;
}

Assistant:

bool BuildLog::OpenForWrite(const string& path, const BuildLogUser& user,
                            string* err) {
  if (needs_recompaction_) {
    if (!Recompact(path, user, err))
      return false;
  }

  assert(!log_file_);
  log_file_path_ = path;  // we don't actually open the file right now, but will
                          // do so on the first write attempt
  return true;
}